

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void vmaskmovps2_(PDISASM pMyDisasm)

{
  PDISASM pMyDisasm_local;
  
  if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
    failDecode(pMyDisasm);
  }
  else if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    strcpy((pMyDisasm->Instruction).Mnemonic,"vmaskmovps");
    vex_EyGy(pMyDisasm);
    if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
      (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
    }
  }
  else {
    failDecode(pMyDisasm);
  }
  return;
}

Assistant:

void __bea_callspec__ vmaskmovps2_(PDISASM pMyDisasm)
{
  if (GV.EVEX.state == InUsePrefix) {
    failDecode(pMyDisasm);
  }
  else if (GV.VEX.state == InUsePrefix) {
    #ifndef BEA_LIGHT_DISASSEMBLY
      (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vmaskmovps");
    #endif
    vex_EyGy(pMyDisasm);
    if (GV.REX.W_ == 1) GV.ERROR_OPCODE = UD_;
  }
  else {
    failDecode(pMyDisasm);
  }
}